

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction.c
# Opt level: O1

int wally_tx_to_hex(wally_tx *tx,uint32_t flags,char **output)

{
  int iVar1;
  int iVar2;
  size_t is_elements;
  size_t local_20;
  
  local_20 = 0;
  iVar1 = wally_tx_is_elements(tx,&local_20);
  iVar2 = -2;
  if (iVar1 == 0) {
    iVar2 = tx_to_hex_or_txid(tx,flags,output,(uchar *)0x0,0,local_20 != 0);
  }
  return iVar2;
}

Assistant:

int wally_tx_to_hex(const struct wally_tx *tx, uint32_t flags,
                    char **output)
{
    size_t is_elements = 0;

#ifdef BUILD_ELEMENTS
    if (wally_tx_is_elements(tx, &is_elements) != WALLY_OK)
        return WALLY_EINVAL;
#endif
    return tx_to_hex_or_txid(tx, flags, output, NULL, 0, is_elements);
}